

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

int slang::ast::BinsSelectExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  ParenthesizedBinsSelectExprSyntax *pPVar2;
  SyntaxNode *this;
  UnaryBinsSelectExprSyntax *syntax;
  BinsSelectExpr *pBVar3;
  BinSelectWithFilterExprSyntax *syntax_00;
  BinaryBinsSelectExprSyntax *syntax_01;
  BinsSelectConditionExprSyntax *syntax_02;
  SimpleBinsSelectExprSyntax *syntax_03;
  logic_error *this_00;
  undefined4 in_register_0000003c;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  while (SVar1 = this->kind, SVar1 == ParenthesizedBinsSelectExpr) {
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedBinsSelectExprSyntax>(this);
    this = &not_null<slang::syntax::BinsSelectExpressionSyntax_*>::get(&pPVar2->expr)->
            super_SyntaxNode;
  }
  if (SVar1 == BinSelectWithFilterExpr) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::BinSelectWithFilterExprSyntax>(this);
    pBVar3 = BinSelectWithFilterExpr::fromSyntax(syntax_00,(ASTContext *)__addr);
  }
  else if (SVar1 == BinaryBinsSelectExpr) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryBinsSelectExprSyntax>(this);
    pBVar3 = BinaryBinsSelectExpr::fromSyntax(syntax_01,(ASTContext *)__addr);
  }
  else if (SVar1 == BinsSelectConditionExpr) {
    syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectConditionExprSyntax>(this);
    pBVar3 = ConditionBinsSelectExpr::fromSyntax(syntax_02,(ASTContext *)__addr);
  }
  else if (SVar1 == SimpleBinsSelectExpr) {
    syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleBinsSelectExprSyntax>(this);
    pBVar3 = SetExprBinsSelectExpr::fromSyntax(syntax_03,(ASTContext *)__addr);
  }
  else {
    if (SVar1 != UnaryBinsSelectExpr) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x3ab);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::UnaryBinsSelectExprSyntax>(this);
    pBVar3 = UnaryBinsSelectExpr::fromSyntax(syntax,(ASTContext *)__addr);
  }
  pBVar3->syntax = this;
  return (int)pBVar3;
}

Assistant:

const BinsSelectExpr& BinsSelectExpr::bind(const BinsSelectExpressionSyntax& syntax,
                                           const ASTContext& context) {
    BinsSelectExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedBinsSelectExpr:
            return bind(*syntax.as<ParenthesizedBinsSelectExprSyntax>().expr, context);
        case SyntaxKind::BinsSelectConditionExpr:
            result = &ConditionBinsSelectExpr::fromSyntax(
                syntax.as<BinsSelectConditionExprSyntax>(), context);
            break;
        case SyntaxKind::UnaryBinsSelectExpr:
            result = &UnaryBinsSelectExpr::fromSyntax(syntax.as<UnaryBinsSelectExprSyntax>(),
                                                      context);
            break;
        case SyntaxKind::BinaryBinsSelectExpr:
            result = &BinaryBinsSelectExpr::fromSyntax(syntax.as<BinaryBinsSelectExprSyntax>(),
                                                       context);
            break;
        case SyntaxKind::SimpleBinsSelectExpr:
            result = &SetExprBinsSelectExpr::fromSyntax(syntax.as<SimpleBinsSelectExprSyntax>(),
                                                        context);
            break;
        case SyntaxKind::BinSelectWithFilterExpr:
            result = &BinSelectWithFilterExpr::fromSyntax(
                syntax.as<BinSelectWithFilterExprSyntax>(), context);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}